

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::type_to_array_glsl_abi_cxx11_(CompilerGLSL *this,SPIRType *type)

{
  bool bVar1;
  size_t sVar2;
  CompilerError *this_00;
  long in_RDX;
  undefined1 local_f0 [40];
  uint32_t i_1;
  allocator local_a1;
  string local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [44];
  uint32_t i;
  allocator local_21;
  long local_20;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *res;
  
  type_local = type;
  this_local = this;
  if ((((*(byte *)(in_RDX + 0x7c) & 1) == 0) || (*(int *)(in_RDX + 0x80) != 0x14e5)) ||
     (*(int *)(in_RDX + 0xc) == 0xf)) {
    local_20 = in_RDX;
    bVar1 = VectorView<unsigned_int>::empty((VectorView<unsigned_int> *)(in_RDX + 0x20));
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",(allocator *)(local_60 + 0x2b));
      ::std::allocator<char>::~allocator((allocator<char> *)(local_60 + 0x2b));
    }
    else if ((type[0x16].array.stack_storage.aligned_char[0] & 1U) == 0) {
      sVar2 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(local_20 + 0x20));
      if (1 < sVar2) {
        if (((type[0x16].array.buffer_capacity & 0x100000000) == 0) &&
           ((uint)type[0x16].array.buffer_capacity < 0x1ae)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_a0,"GL_ARB_arrays_of_arrays",&local_a1);
          require_extension_internal((CompilerGLSL *)type,(string *)local_a0);
          ::std::__cxx11::string::~string(local_a0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        }
        else if (((type[0x16].array.buffer_capacity & 0x100000000) != 0) &&
                ((uint)type[0x16].array.buffer_capacity < 0x136)) {
          local_f0[0x26] = 1;
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&i_1,
                     "Arrays of arrays not supported before ESSL version 310. Try using --flatten-multidimensional-arrays or set options.flatten_multidimensional_arrays to true."
                     ,(allocator *)(local_f0 + 0x27));
          CompilerError::CompilerError(this_00,(string *)&i_1);
          local_f0[0x26] = 0;
          __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
      local_f0[0x25] = 0;
      ::std::__cxx11::string::string((string *)this);
      sVar2 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(local_20 + 0x20));
      for (local_f0._32_4_ = (undefined4)sVar2; local_f0._32_4_ != 0;
          local_f0._32_4_ = local_f0._32_4_ + -1) {
        ::std::__cxx11::string::operator+=((string *)this,"[");
        to_array_size_abi_cxx11_((CompilerGLSL *)local_f0,type,(uint32_t)local_20);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_f0);
        ::std::__cxx11::string::~string((string *)local_f0);
        ::std::__cxx11::string::operator+=((string *)this,"]");
      }
    }
    else {
      local_60[0x2a] = '\0';
      ::std::__cxx11::string::string((string *)this);
      ::std::__cxx11::string::operator+=((string *)this,"[");
      sVar2 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)(local_20 + 0x20));
      for (local_60._36_4_ = (undefined4)sVar2; local_60._36_4_ != 0;
          local_60._36_4_ = local_60._36_4_ - 1) {
        to_array_size_abi_cxx11_((CompilerGLSL *)local_80,type,(uint32_t)local_20);
        enclose_expression((CompilerGLSL *)local_60,(string *)type);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_60);
        ::std::__cxx11::string::~string((string *)local_60);
        ::std::__cxx11::string::~string((string *)local_80);
        if (1 < (uint)local_60._36_4_) {
          ::std::__cxx11::string::operator+=((string *)this," * ");
        }
      }
      ::std::__cxx11::string::operator+=((string *)this,"]");
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return this;
}

Assistant:

string CompilerGLSL::type_to_array_glsl(const SPIRType &type)
{
	if (type.pointer && type.storage == StorageClassPhysicalStorageBufferEXT && type.basetype != SPIRType::Struct)
	{
		// We are using a wrapped pointer type, and we should not emit any array declarations here.
		return "";
	}

	if (type.array.empty())
		return "";

	if (options.flatten_multidimensional_arrays)
	{
		string res;
		res += "[";
		for (auto i = uint32_t(type.array.size()); i; i--)
		{
			res += enclose_expression(to_array_size(type, i - 1));
			if (i > 1)
				res += " * ";
		}
		res += "]";
		return res;
	}
	else
	{
		if (type.array.size() > 1)
		{
			if (!options.es && options.version < 430)
				require_extension_internal("GL_ARB_arrays_of_arrays");
			else if (options.es && options.version < 310)
				SPIRV_CROSS_THROW("Arrays of arrays not supported before ESSL version 310. "
				                  "Try using --flatten-multidimensional-arrays or set "
				                  "options.flatten_multidimensional_arrays to true.");
		}

		string res;
		for (auto i = uint32_t(type.array.size()); i; i--)
		{
			res += "[";
			res += to_array_size(type, i - 1);
			res += "]";
		}
		return res;
	}
}